

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_chunk.cpp
# Opt level: O3

void __thiscall duckdb::DataChunk::Slice(DataChunk *this,idx_t offset,idx_t slice_count)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  sel_t sVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar7 [16];
  SelectionVector sel;
  SelectionVector local_30;
  long lVar6;
  
  SelectionVector::SelectionVector(&local_30,slice_count);
  auVar1 = _DAT_01d84390;
  if (slice_count != 0) {
    lVar6 = slice_count - 1;
    auVar4._8_4_ = (int)lVar6;
    auVar4._0_8_ = lVar6;
    auVar4._12_4_ = (int)((ulong)lVar6 >> 0x20);
    uVar2 = 0;
    auVar4 = auVar4 ^ _DAT_01d84390;
    auVar5 = _DAT_01d84380;
    do {
      auVar7 = auVar5 ^ auVar1;
      sVar3 = (sel_t)offset;
      if ((bool)(~(auVar7._4_4_ == auVar4._4_4_ && auVar4._0_4_ < auVar7._0_4_ ||
                  auVar4._4_4_ < auVar7._4_4_) & 1)) {
        local_30.sel_vector[uVar2] = sVar3;
      }
      if ((auVar7._12_4_ != auVar4._12_4_ || auVar7._8_4_ <= auVar4._8_4_) &&
          auVar7._12_4_ <= auVar4._12_4_) {
        local_30.sel_vector[uVar2 + 1] = sVar3 + 1;
      }
      uVar2 = uVar2 + 2;
      lVar6 = auVar5._8_8_;
      auVar5._0_8_ = auVar5._0_8_ + 2;
      auVar5._8_8_ = lVar6 + 2;
      offset = (idx_t)(sVar3 + 2);
    } while ((slice_count + 1 & 0xfffffffffffffffe) != uVar2);
  }
  Slice(this,&local_30,slice_count);
  if (local_30.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

void DataChunk::Slice(idx_t offset, idx_t slice_count) {
	D_ASSERT(offset + slice_count <= size());
	SelectionVector sel(slice_count);
	for (idx_t i = 0; i < slice_count; i++) {
		sel.set_index(i, offset + i);
	}
	Slice(sel, slice_count);
}